

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void init_client_web(int port,char *address)

{
  int iVar1;
  undefined1 local_28 [8];
  sockaddr_in web_addr;
  char *address_local;
  int port_local;
  
  web_addr.sin_zero = (uchar  [8])address;
  sock = socket(2,1,0);
  if (sock == -1) {
    perror("Socket");
    exit(1);
  }
  local_28._0_2_ = 2;
  local_28._2_2_ = htons((uint16_t)port);
  iVar1 = inet_aton((char *)web_addr.sin_zero,(in_addr *)(local_28 + 4));
  if (iVar1 == 0) {
    perror("inet_aton");
    exit(1);
  }
  iVar1 = connect(sock,(sockaddr *)local_28,0x10);
  if (iVar1 == -1) {
    perror("connect");
    exit(1);
  }
  return;
}

Assistant:

void init_client_web(int port, char*address){
    sock = socket(AF_INET,SOCK_STREAM,0);
    if(sock == -1){
        perror("Socket");
        exit(EXIT_FAILURE);
    }
    struct sockaddr_in web_addr;
    web_addr.sin_family = AF_INET;
    web_addr.sin_port = htons((uint16_t) port);

    if (inet_aton(address, &web_addr.sin_addr) == 0) {
        perror("inet_aton");
        exit(EXIT_FAILURE);
    }

    if(connect(sock,(struct sockaddr *)&web_addr,sizeof(web_addr)) == -1){
        perror("connect");
        exit(EXIT_FAILURE);
    }
}